

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

HRESULT GenerateByteCode(ParseNodeProg *pnode,uint32 grfscr,ScriptContext *scriptContext,
                        ParseableFunctionInfo **ppRootFunc,uint sourceIndex,bool forceNoNative,
                        Parser *parser,CompileScriptException *pse,ScopeInfo *parentScopeInfo,
                        ScriptFunction **functionRef)

{
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  AutoNestedHandledExceptionType local_224;
  undefined1 local_220 [4];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  ByteCodeGenerator byteCodeGenerator;
  HRESULT hr;
  bool forceNoNative_local;
  uint sourceIndex_local;
  ParseableFunctionInfo **ppRootFunc_local;
  ScriptContext *scriptContext_local;
  uint32 grfscr_local;
  ParseNodeProg *pnode_local;
  
  ByteCodeGenerator::ByteCodeGenerator((ByteCodeGenerator *)local_220,scriptContext,parentScopeInfo)
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_224,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  ByteCodeGenerator::Generate
            (pnode,grfscr,(ByteCodeGenerator *)local_220,ppRootFunc,sourceIndex,forceNoNative,parser
             ,functionRef);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_224);
  ByteCodeGenerator::~ByteCodeGenerator((ByteCodeGenerator *)local_220);
  return 0;
}

Assistant:

HRESULT GenerateByteCode(__in ParseNodeProg *pnode, __in uint32 grfscr, __in Js::ScriptContext* scriptContext, __inout Js::ParseableFunctionInfo ** ppRootFunc,
                         __in uint sourceIndex, __in bool forceNoNative, __in Parser* parser, __in CompileScriptException *pse, Js::ScopeInfo* parentScopeInfo,
                        Js::ScriptFunction ** functionRef)
{
    HRESULT hr = S_OK;
    ByteCodeGenerator byteCodeGenerator(scriptContext, parentScopeInfo);
    BEGIN_TRANSLATE_EXCEPTION_TO_HRESULT_NESTED
    {
        // Main code.
        ByteCodeGenerator::Generate(pnode, grfscr, &byteCodeGenerator, ppRootFunc, sourceIndex, forceNoNative, parser, functionRef);
    }